

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.h
# Opt level: O0

Quat<float> Imath_2_5::extractQuat<float>(Matrix44<float> *mat)

{
  float fVar1;
  float *pfVar2;
  Matrix44<float> *in_RSI;
  float *in_RDI;
  double dVar3;
  undefined8 uVar4;
  Quat<float> QVar5;
  int nxt [3];
  int k;
  int j;
  int i;
  float q [4];
  float s;
  float tr;
  Matrix44<float> rot;
  Quat<float> *quat;
  undefined4 in_stack_ffffffffffffff40;
  float fVar6;
  undefined4 in_stack_ffffffffffffff44;
  int local_80 [4];
  int local_70;
  int local_6c;
  float local_68 [4];
  float local_58;
  float local_54;
  Matrix44<float> *local_10;
  
  local_10 = in_RSI;
  Matrix44<float>::Matrix44
            ((Matrix44<float> *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  Quat<float>::Quat((Quat<float> *)0x1830a8);
  local_80[0] = 1;
  local_80[1] = 2;
  local_80[2] = 0;
  pfVar2 = Matrix44<float>::operator[](local_10,0);
  fVar6 = *pfVar2;
  pfVar2 = Matrix44<float>::operator[](local_10,1);
  fVar1 = pfVar2[1];
  pfVar2 = Matrix44<float>::operator[](local_10,2);
  local_54 = fVar6 + fVar1 + pfVar2[2];
  if (local_54 <= 0.0) {
    local_6c = 0;
    pfVar2 = Matrix44<float>::operator[](local_10,1);
    fVar6 = pfVar2[1];
    pfVar2 = Matrix44<float>::operator[](local_10,0);
    if (*pfVar2 <= fVar6 && fVar6 != *pfVar2) {
      local_6c = 1;
    }
    pfVar2 = Matrix44<float>::operator[](local_10,2);
    fVar6 = pfVar2[2];
    pfVar2 = Matrix44<float>::operator[](local_10,local_6c);
    if (pfVar2[local_6c] <= fVar6 && fVar6 != pfVar2[local_6c]) {
      local_6c = 2;
    }
    local_70 = local_80[local_6c];
    local_80[3] = local_80[local_80[local_6c]];
    pfVar2 = Matrix44<float>::operator[](local_10,local_6c);
    fVar6 = pfVar2[local_6c];
    pfVar2 = Matrix44<float>::operator[](local_10,local_70);
    fVar1 = pfVar2[local_70];
    pfVar2 = Matrix44<float>::operator[](local_10,local_80[3]);
    dVar3 = Math<float>::sqrt((double)(ulong)(uint)((fVar6 - (fVar1 + pfVar2[local_80[3]])) + 1.0));
    local_58 = SUB84(dVar3,0);
    local_68[local_6c] = local_58 * 0.5;
    uVar4 = 0;
    if ((local_58 != 0.0) || (NAN(local_58))) {
      local_58 = 0.5 / local_58;
    }
    pfVar2 = Matrix44<float>::operator[](local_10,local_70);
    fVar6 = pfVar2[local_80[3]];
    pfVar2 = Matrix44<float>::operator[](local_10,local_80[3]);
    local_68[3] = (fVar6 - pfVar2[local_70]) * local_58;
    pfVar2 = Matrix44<float>::operator[](local_10,local_6c);
    fVar6 = pfVar2[local_70];
    pfVar2 = Matrix44<float>::operator[](local_10,local_70);
    local_68[local_70] = (fVar6 + pfVar2[local_6c]) * local_58;
    pfVar2 = Matrix44<float>::operator[](local_10,local_6c);
    fVar6 = pfVar2[local_80[3]];
    pfVar2 = Matrix44<float>::operator[](local_10,local_80[3]);
    local_68[local_80[3]] = (fVar6 + pfVar2[local_6c]) * local_58;
    in_RDI[1] = local_68[0];
    in_RDI[2] = local_68[1];
    in_RDI[3] = local_68[2];
    *in_RDI = local_68[3];
  }
  else {
    dVar3 = Math<float>::sqrt((double)(ulong)(uint)(local_54 + 1.0));
    uVar4 = 0x40000000;
    *in_RDI = SUB84(dVar3,0) / 2.0;
    local_58 = 0.5 / SUB84(dVar3,0);
    pfVar2 = Matrix44<float>::operator[](local_10,1);
    fVar6 = pfVar2[2];
    pfVar2 = Matrix44<float>::operator[](local_10,2);
    in_RDI[1] = (fVar6 - pfVar2[1]) * local_58;
    pfVar2 = Matrix44<float>::operator[](local_10,2);
    fVar6 = *pfVar2;
    pfVar2 = Matrix44<float>::operator[](local_10,0);
    in_RDI[2] = (fVar6 - pfVar2[2]) * local_58;
    pfVar2 = Matrix44<float>::operator[](local_10,0);
    fVar6 = pfVar2[1];
    pfVar2 = Matrix44<float>::operator[](local_10,1);
    local_68[3] = (fVar6 - *pfVar2) * local_58;
    in_RDI[3] = local_68[3];
  }
  QVar5.v.x = 0.0;
  QVar5.r = local_68[3];
  QVar5.v.y = (float)(int)uVar4;
  QVar5.v.z = (float)(int)((ulong)uVar4 >> 0x20);
  return QVar5;
}

Assistant:

Quat<T>
extractQuat (const Matrix44<T> &mat)
{
  Matrix44<T> rot;

  T        tr, s;
  T         q[4];
  int    i, j, k;
  Quat<T>   quat;

  int nxt[3] = {1, 2, 0};
  tr = mat[0][0] + mat[1][1] + mat[2][2];

  // check the diagonal
  if (tr > 0.0) {
     s = Math<T>::sqrt (tr + T(1.0));
     quat.r = s / T(2.0);
     s = T(0.5) / s;

     quat.v.x = (mat[1][2] - mat[2][1]) * s;
     quat.v.y = (mat[2][0] - mat[0][2]) * s;
     quat.v.z = (mat[0][1] - mat[1][0]) * s;
  } 
  else {      
     // diagonal is negative
     i = 0;
     if (mat[1][1] > mat[0][0]) 
        i=1;
     if (mat[2][2] > mat[i][i]) 
        i=2;
    
     j = nxt[i];
     k = nxt[j];
     s = Math<T>::sqrt ((mat[i][i] - (mat[j][j] + mat[k][k])) + T(1.0));
      
     q[i] = s * T(0.5);
     if (s != T(0.0)) 
        s = T(0.5) / s;

     q[3] = (mat[j][k] - mat[k][j]) * s;
     q[j] = (mat[i][j] + mat[j][i]) * s;
     q[k] = (mat[i][k] + mat[k][i]) * s;

     quat.v.x = q[0];
     quat.v.y = q[1];
     quat.v.z = q[2];
     quat.r = q[3];
 }

  return quat;
}